

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_strtype.cc
# Opt level: O0

void __thiscall
StringType::GenDynamicSizeRegEx(StringType *this,Output *out_cc,Env *env,DataPtr *data)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  StringType *in_RDX;
  ID *in_RSI;
  string *in_RDI;
  string tmp;
  ID *in_stack_ffffffffffffff08;
  ID *in_stack_ffffffffffffff30;
  ID *id;
  Env *in_stack_ffffffffffffff38;
  ID *this_00;
  undefined7 in_stack_ffffffffffffff68;
  undefined1 uVar4;
  undefined8 in_stack_ffffffffffffff70;
  undefined1 v;
  Env *env_00;
  ID *in_stack_ffffffffffffff78;
  ID *pIVar5;
  Env *in_stack_ffffffffffffff80;
  string local_60 [32];
  StringType *local_18;
  ID *local_10;
  
  v = (undefined1)((ulong)in_stack_ffffffffffffff70 >> 0x38);
  local_18 = in_RDX;
  local_10 = in_RSI;
  string_length_var(in_RDX);
  pcVar1 = Env::LValue((Env *)in_RDX,in_stack_ffffffffffffff08);
  uVar4 = 0;
  Output::println((Output *)in_RSI,"%s = ",pcVar1);
  Output::inc_indent((Output *)local_10);
  pIVar5 = local_10;
  RegEx::matcher_id(*(RegEx **)((long)&in_RDI[0xc].field_2 + 8));
  pcVar1 = Env::RValue(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  Output::println((Output *)pIVar5,"%s.%s(",pcVar1,RegEx::kMatchPrefix);
  Output::inc_indent((Output *)local_10);
  id = local_10;
  pcVar1 = DataPtr::ptr_expr((DataPtr *)0x14b138);
  Output::println((Output *)id,"%s,",pcVar1);
  this_00 = local_10;
  pcVar1 = Env::RValue((Env *)local_10,id);
  pcVar2 = DataPtr::ptr_expr((DataPtr *)0x14b186);
  Output::println((Output *)this_00,"%s - %s);",pcVar1,pcVar2);
  Output::dec_indent((Output *)local_10);
  Output::dec_indent((Output *)local_10);
  string_length_var(in_RDX);
  Env::SetEvaluated(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(bool)v);
  pIVar5 = local_10;
  string_length_var(in_RDX);
  pcVar1 = Env::RValue((Env *)this_00,id);
  Output::println((Output *)pIVar5,"if ( %s < 0 )",pcVar1);
  Output::inc_indent((Output *)local_10);
  Output::println((Output *)local_10,"{");
  RegEx::str_abi_cxx11_(*(RegEx **)((long)&in_RDI[0xc].field_2 + 8));
  uVar3 = std::__cxx11::string::c_str();
  env_00 = (Env *)&stack0xffffffffffffffc0;
  strfmt_abi_cxx11_((char *)env_00,"\"%s\"",uVar3);
  pIVar5 = local_10;
  std::__cxx11::string::string(local_60,(string *)env_00);
  GenStringMismatch(local_18,(Output *)pIVar5,env_00,
                    (DataPtr *)CONCAT17(uVar4,in_stack_ffffffffffffff68),in_RDI);
  std::__cxx11::string::~string(local_60);
  Output::println((Output *)local_10,"}");
  Output::dec_indent((Output *)local_10);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

void StringType::GenDynamicSizeRegEx(Output* out_cc, Env* env, const DataPtr& data)
	{
	// string_length_var =
	// 	matcher.match_prefix(
	// 		begin,
	//		end);

	out_cc->println("%s = ", env->LValue(string_length_var()));
	out_cc->inc_indent();

	out_cc->println("%s.%s(", env->RValue(regex_->matcher_id()), RegEx::kMatchPrefix);

	out_cc->inc_indent();
	out_cc->println("%s,", data.ptr_expr());
	out_cc->println("%s - %s);", env->RValue(end_of_data), data.ptr_expr());

	out_cc->dec_indent();
	out_cc->dec_indent();

	env->SetEvaluated(string_length_var());

	out_cc->println("if ( %s < 0 )", env->RValue(string_length_var()));
	out_cc->inc_indent();
	out_cc->println("{");
	string tmp = strfmt("\"%s\"", regex_->str().c_str());
	GenStringMismatch(out_cc, env, data, tmp);
	out_cc->println("}");
	out_cc->dec_indent();
	}